

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_logic(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  int rt_local;
  int rs_local;
  int rd_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rd != 0) {
    switch(opc) {
    case 0x24:
      if (rs == 0 || rt == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
      }
      else {
        tcg_gen_and_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs],
                   tcg_ctx_00->cpu_gpr[rt]);
      }
      break;
    case 0x25:
      if (rs == 0 || rt == 0) {
        if ((rs == 0) && (rt != 0)) {
          tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rt]);
        }
        else if ((rs == 0) || (rt != 0)) {
          tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
        }
        else {
          tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs]);
        }
      }
      else {
        tcg_gen_or_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs],
                   tcg_ctx_00->cpu_gpr[rt]);
      }
      break;
    case 0x26:
      if (rs == 0 || rt == 0) {
        if ((rs == 0) && (rt != 0)) {
          tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rt]);
        }
        else if ((rs == 0) || (rt != 0)) {
          tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],0);
        }
        else {
          tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs]);
        }
      }
      else {
        tcg_gen_xor_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs],
                   tcg_ctx_00->cpu_gpr[rt]);
      }
      break;
    case 0x27:
      if ((rs == 0) || (rt == 0)) {
        if ((rs == 0) && (rt != 0)) {
          tcg_gen_not_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rt]);
        }
        else if ((rs == 0) || (rt != 0)) {
          tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],-1);
        }
        else {
          tcg_gen_not_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs]);
        }
      }
      else {
        tcg_gen_nor_i64_mips64el
                  (tcg_ctx_00,tcg_ctx_00->cpu_gpr[rd],tcg_ctx_00->cpu_gpr[rs],
                   tcg_ctx_00->cpu_gpr[rt]);
      }
    }
  }
  return;
}

Assistant:

static void gen_logic(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    switch (opc) {
    case OPC_AND:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_and_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_NOR:
        if (rs != 0 && rt != 0) {
            tcg_gen_nor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], ~((target_ulong)0));
        }
        break;
    case OPC_OR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_XOR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    }
}